

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

void __thiscall
Js::NumberFormatPartsBuilder::NumberFormatPartsBuilder
          (NumberFormatPartsBuilder *this,double num,char16 *formatted,charcount_t formattedLength,
          ScriptContext *scriptContext)

{
  ScriptContext *this_00;
  Recycler *pRVar1;
  UNumberFormatFields *ptr;
  UNumberFormatFields **ppUVar2;
  TrackAllocData local_58;
  ScriptContext *local_30;
  ScriptContext *scriptContext_local;
  char16 *pcStack_20;
  charcount_t formattedLength_local;
  char16 *formatted_local;
  double num_local;
  NumberFormatPartsBuilder *this_local;
  
  this->num = num;
  local_30 = scriptContext;
  scriptContext_local._4_4_ = formattedLength;
  pcStack_20 = formatted;
  formatted_local = (char16 *)num;
  num_local = (double)this;
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierPtr(&this->formatted,formatted);
  this->formattedLength = scriptContext_local._4_4_;
  Memory::WriteBarrierPtr<Js::ScriptContext>::WriteBarrierPtr(&this->sc,local_30);
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->sc);
  pRVar1 = ScriptContext::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&UNumberFormatFields::typeinfo,0,
             (ulong)scriptContext_local._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
             ,0x90d);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_58);
  ptr = Memory::AllocateArray<Memory::Recycler,UNumberFormatFields,false>
                  ((Memory *)pRVar1,(Recycler *)Memory::Recycler::AllocLeaf,0,
                   (ulong)scriptContext_local._4_4_);
  Memory::WriteBarrierPtr<UNumberFormatFields>::WriteBarrierPtr(&this->fields,ptr);
  ppUVar2 = Memory::WriteBarrierPtr::operator_cast_to_UNumberFormatFields__
                      ((WriteBarrierPtr *)&this->fields);
  memset(*ppUVar2,0xff,(ulong)scriptContext_local._4_4_ << 2);
  return;
}

Assistant:

NumberFormatPartsBuilder(double num, const char16 *formatted, charcount_t formattedLength, ScriptContext *scriptContext)
            : num(num)
            , formatted(formatted)
            , formattedLength(formattedLength)
            , sc(scriptContext)
            , fields(RecyclerNewArrayLeaf(sc->GetRecycler(), UNumberFormatFields, formattedLength))
        {
            // this will allow InsertPart to tell what fields have been initialized or not, and will
            // be the value of resulting { type: "literal" } fields in ToPartsArray
            memset(fields, UnsetField, sizeof(UNumberFormatFields) * formattedLength);
        }